

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTypeSpecFldInfo.cpp
# Opt level: O2

void __thiscall
ObjTypeSpecFldInfoArray::SetInfo
          (ObjTypeSpecFldInfoArray *this,Recycler *recycler,FunctionBody *functionBody,uint index,
          ObjTypeSpecFldInfo *info)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4cd,"(recycler)","recycler");
    if (!bVar2) goto LAB_005a3d6e;
    *puVar4 = 0;
  }
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4ce,"(functionBody)","functionBody");
    if (!bVar2) goto LAB_005a3d6e;
    *puVar4 = 0;
  }
  if ((this->infoArray).ptr != (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
    uVar3 = Js::FunctionBody::GetInlineCacheCount(functionBody);
    if (uVar3 != this->infoCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                         ,0x4cf,
                         "(this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount)"
                         ,
                         "this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount"
                        );
      if (!bVar2) goto LAB_005a3d6e;
      *puVar4 = 0;
    }
  }
  uVar3 = Js::FunctionBody::GetInlineCacheCount(functionBody);
  if (uVar3 <= index) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4d0,"(index < functionBody->GetInlineCacheCount())",
                       "index < functionBody->GetInlineCacheCount()");
    if (!bVar2) goto LAB_005a3d6e;
    *puVar4 = 0;
  }
  if (info == (ObjTypeSpecFldInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ObjTypeSpecFldInfo.cpp"
                       ,0x4d1,"(info)","info");
    if (!bVar2) {
LAB_005a3d6e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  EnsureArray(this,recycler,functionBody);
  Memory::WriteBarrierPtr<ObjTypeSpecFldInfo>::WriteBarrierSet((this->infoArray).ptr + index,info);
  return;
}

Assistant:

void ObjTypeSpecFldInfoArray::SetInfo(Recycler *const recycler, Js::FunctionBody *const functionBody,
    const uint index, ObjTypeSpecFldInfo* info)
{
    Assert(recycler);
    Assert(functionBody);
    Assert(this->infoArray == nullptr || functionBody->GetInlineCacheCount() == this->infoCount);
    Assert(index < functionBody->GetInlineCacheCount());
    Assert(info);

    EnsureArray(recycler, functionBody);
    this->infoArray[index] = info;
}